

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O3

void UnityAssertEqualStringArray
               (char **expected,char **actual,_UU32 num_elements,char *msg,_U_UINT lineNumber)

{
  char *pcVar1;
  char cVar2;
  char *pcVar3;
  int iVar4;
  ulong uVar5;
  _U_UINT number;
  
  if (Unity.CurrentTestIgnored == 0 && Unity.CurrentTestFailed == 0) {
    if (num_elements == 0) {
      UnityTestResultsFailBegin(lineNumber);
      UnityPrint(" You Asked Me To Compare Nothing, Which Was Pointless.");
LAB_00102138:
      UnityAddMsgIfSpecified(msg);
      Unity.CurrentTestFailed = 1;
      longjmp((__jmp_buf_tag *)Unity.AbortFrame,1);
    }
    iVar4 = UnityCheckArraysForNull(expected,actual,lineNumber,msg);
    if (iVar4 == 0) {
      number = 0;
      do {
        pcVar3 = actual[number];
        if (expected[number] == (char *)0x0) {
          if (pcVar3 == (char *)0x0) goto LAB_001020e2;
LAB_001020fe:
          Unity.CurrentTestFailed = 1;
LAB_00102106:
          UnityTestResultsFailBegin(lineNumber);
          if (num_elements != 1) {
            UnityPrint(" Element ");
            UnityPrintNumberUnsigned(number);
          }
          UnityPrintExpectedAndActualStrings(expected[number],actual[number]);
          goto LAB_00102138;
        }
        if (pcVar3 == (char *)0x0) goto LAB_001020fe;
        uVar5 = 0;
        while( true ) {
          cVar2 = expected[number][uVar5];
          pcVar1 = pcVar3 + uVar5;
          if (cVar2 == '\0' && *pcVar1 == '\0') break;
          uVar5 = (ulong)((int)uVar5 + 1);
          if (cVar2 != *pcVar1) goto LAB_001020fe;
        }
LAB_001020e2:
        if (Unity.CurrentTestFailed != 0) {
          number = 0;
          goto LAB_00102106;
        }
        number = number + 1;
      } while (number != num_elements);
    }
  }
  return;
}

Assistant:

void UnityAssertEqualStringArray( const char** expected,
                                  const char** actual,
                                  const _UU32 num_elements,
                                  const char* msg,
                                  const UNITY_LINE_TYPE lineNumber)
{
    _UU32 i, j = 0;

    UNITY_SKIP_EXECUTION;

    /* if no elements, it's an error */
    if (num_elements == 0)
    {
        UnityPrintPointlessAndBail();
    }

    if (UnityCheckArraysForNull((UNITY_INTERNAL_PTR)expected, (UNITY_INTERNAL_PTR)actual, lineNumber, msg) == 1)
        return;

    do
    {
        /* if both pointers not null compare the strings */
        if (expected[j] && actual[j])
        {
            for (i = 0; expected[j][i] || actual[j][i]; i++)
            {
                if (expected[j][i] != actual[j][i])
                {
                    Unity.CurrentTestFailed = 1;
                    break;
                }
            }
        }
        else
        { /* handle case of one pointers being null (if both null, test should pass) */
            if (expected[j] != actual[j])
            {
                Unity.CurrentTestFailed = 1;
            }
        }

        if (Unity.CurrentTestFailed)
        {
            UnityTestResultsFailBegin(lineNumber);
            if (num_elements > 1)
            {
                UnityPrint(UnityStrElement);
                UnityPrintNumberUnsigned(j);
            }
            UnityPrintExpectedAndActualStrings((const char*)(expected[j]), (const char*)(actual[j]));
            UnityAddMsgIfSpecified(msg);
            UNITY_FAIL_AND_BAIL;
        }
    } while (++j < num_elements);
}